

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::AddSharedDepItem(cmComputeLinkInformation *this,LinkEntry *entry)

{
  string *config;
  cmGeneratorTarget *this_00;
  bool bVar1;
  TargetType TVar2;
  cmOrderDirectories *this_01;
  string soName;
  string lib;
  string local_68;
  string local_48;
  
  this_00 = entry->Target;
  if ((((this_00 != (cmGeneratorTarget *)0x0) &&
       (TVar2 = cmGeneratorTarget::GetType(this_00), TVar2 == SHARED_LIBRARY)) &&
      (bVar1 = cmGeneratorTarget::IsDLLPlatform(this->Target), bVar1)) &&
     (this->SharedDependencyMode != SharedDepModeLink)) {
    AddRuntimeDLL(this,this_00);
  }
  if (this->SharedDependencyMode == SharedDepModeNone) {
    return;
  }
  if (this_00 == (cmGeneratorTarget *)0x0) {
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)entry);
    if (!bVar1) {
      return;
    }
    cmsys::SystemTools::GetFilenameName(&local_48,(string *)entry);
    bVar1 = cmsys::RegularExpression::find
                      (&this->ExtractSharedLibraryName,local_48._M_dataplus._M_p,
                       &(this->ExtractSharedLibraryName).regmatch);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar1) {
      return;
    }
  }
  else {
    TVar2 = cmGeneratorTarget::GetType(this_00);
    if (TVar2 != SHARED_LIBRARY) {
      return;
    }
  }
  if (this->SharedDependencyMode == SharedDepModeLink) {
LAB_004e7384:
    AddItem(this,entry);
  }
  else {
    if (this_00 == (cmGeneratorTarget *)0x0) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48._M_string_length = 0;
      local_48.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::_M_assign((string *)&local_48);
      AddLibraryRuntimeInfo(this,&local_48);
    }
    else {
      bVar1 = cmGeneratorTarget::IsImported(this_00);
      if (bVar1) {
        bVar1 = cmGeneratorTarget::HasKnownRuntimeArtifactLocation(this_00,&this->Config);
        if ((!bVar1) &&
           (bVar1 = cmGeneratorTarget::LinkerEnforcesNoAllowShLibUndefined
                              (this->Target,&this->Config), bVar1)) goto LAB_004e7384;
      }
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      local_48._M_string_length = 0;
      local_48.field_2._M_local_buf[0] = '\0';
      config = &this->Config;
      bVar1 = cmGeneratorTarget::HasImportLibrary(this_00,config);
      cmGeneratorTarget::GetFullPath(&local_68,this_00,config,(uint)bVar1,false);
      std::__cxx11::string::operator=((string *)&local_48,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      bVar1 = cmGeneratorTarget::IsApple(this_00);
      if ((bVar1) && (bVar1 = cmGeneratorTarget::HasImportLibrary(this_00,config), bVar1)) {
        cmGeneratorTarget::GetFullPath(&local_68,this_00,config,RuntimeBinaryArtifact,true);
        AddLibraryRuntimeInfo(this,&local_68,this_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        AddLibraryRuntimeInfo(this,&local_48,this_00);
      }
    }
    if (this->SharedDependencyMode == SharedDepModeDir) {
      this_01 = (this->OrderDependentRPath)._M_t.
                super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl;
    }
    else if ((this->SharedDependencyMode == SharedDepModeLibDir) &&
            (this->LinkWithRuntimePath == false)) {
      this_01 = (this->OrderLinkerSearchPath)._M_t.
                super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
                .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl;
    }
    else {
      this_01 = (cmOrderDirectories *)0x0;
    }
    if (this_01 != (cmOrderDirectories *)0x0) {
      if (this_00 == (cmGeneratorTarget *)0x0) {
        cmOrderDirectories::AddRuntimeLibrary(this_01,&local_48,(char *)0x0);
      }
      else {
        cmGeneratorTarget::GetSOName(&local_68,this_00,&this->Config,RuntimeBinaryArtifact);
        if ((char *)local_68._M_string_length != (char *)0x0) {
          local_68._M_string_length = (size_type)local_68._M_dataplus._M_p;
        }
        cmOrderDirectories::AddRuntimeLibrary(this_01,&local_48,(char *)local_68._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,
                      CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                               local_48.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void cmComputeLinkInformation::AddSharedDepItem(LinkEntry const& entry)
{
  BT<std::string> const& item = entry.Item;
  const cmGeneratorTarget* tgt = entry.Target;

  // Record dependencies on DLLs.
  if (tgt && tgt->GetType() == cmStateEnums::SHARED_LIBRARY &&
      this->Target->IsDLLPlatform() &&
      this->SharedDependencyMode != SharedDepModeLink) {
    this->AddRuntimeDLL(tgt);
  }

  // If dropping shared library dependencies, ignore them.
  if (this->SharedDependencyMode == SharedDepModeNone) {
    return;
  }

  // The user may have incorrectly named an item.  Skip items that are
  // not full paths to shared libraries.
  if (tgt) {
    // The target will provide a full path.  Make sure it is a shared
    // library.
    if (tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return;
    }
  } else {
    // Skip items that are not full paths.  We will not be able to
    // reliably specify them.
    if (!cmSystemTools::FileIsFullPath(item.Value)) {
      return;
    }

    // Get the name of the library from the file name.
    std::string file = cmSystemTools::GetFilenameName(item.Value);
    if (!this->ExtractSharedLibraryName.find(file)) {
      // This is not the name of a shared library.
      return;
    }
  }

  // If in linking mode, just link to the shared library.
  if (this->SharedDependencyMode == SharedDepModeLink ||
      // For an imported shared library without a known runtime artifact,
      // such as a CUDA stub, a library file named with the real soname
      // may not be available at all, so '-rpath-link' cannot help linkers
      // find it to satisfy '--no-allow-shlib-undefined' recursively.
      // Pass this dependency to the linker explicitly just in case.
      // If the linker also uses '--as-needed' behavior, this will not
      // add an unnecessary direct dependency.
      (tgt && tgt->IsImported() &&
       !tgt->HasKnownRuntimeArtifactLocation(this->Config) &&
       this->Target->LinkerEnforcesNoAllowShLibUndefined(this->Config))) {
    this->AddItem(entry);
    return;
  }

  // Get a full path to the dependent shared library.
  // Add it to the runtime path computation so that the target being
  // linked will be able to find it.
  std::string lib;
  if (tgt) {
    cmStateEnums::ArtifactType artifact = tgt->HasImportLibrary(this->Config)
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    lib = tgt->GetFullPath(this->Config, artifact);
    if (tgt->IsApple() && tgt->HasImportLibrary(this->Config)) {
      // Use the library rather than the tbd file for runpath computation
      this->AddLibraryRuntimeInfo(
        tgt->GetFullPath(this->Config, cmStateEnums::RuntimeBinaryArtifact,
                         true),
        tgt);
    } else {
      this->AddLibraryRuntimeInfo(lib, tgt);
    }
  } else {
    lib = item.Value;
    this->AddLibraryRuntimeInfo(lib);
  }

  // Check if we need to include the dependent shared library in other
  // path ordering.
  cmOrderDirectories* order = nullptr;
  if (this->SharedDependencyMode == SharedDepModeLibDir &&
      !this->LinkWithRuntimePath /* AddLibraryRuntimeInfo adds it */) {
    // Add the item to the linker search path.
    order = this->OrderLinkerSearchPath.get();
  } else if (this->SharedDependencyMode == SharedDepModeDir) {
    // Add the item to the separate dependent library search path.
    order = this->OrderDependentRPath.get();
  }
  if (order) {
    if (tgt) {
      std::string soName = tgt->GetSOName(this->Config);
      const char* soname = soName.empty() ? nullptr : soName.c_str();
      order->AddRuntimeLibrary(lib, soname);
    } else {
      order->AddRuntimeLibrary(lib);
    }
  }
}